

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O3

void mdct_init(mdct_lookup *lookup,int n)

{
  char cVar1;
  int *piVar2;
  float *pfVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  int acc;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar11 = n + 3;
  if (-1 < n) {
    iVar11 = n;
  }
  uVar6 = iVar11 >> 2;
  piVar2 = (int *)malloc((long)(int)uVar6 << 2);
  pfVar3 = (float *)malloc((long)(int)(n + uVar6) << 2);
  dVar12 = log((double)n);
  dVar12 = rint(dVar12 / 0.6931471805599453);
  lookup->log2n = (int)dVar12;
  lookup->n = n;
  lookup->trig = pfVar3;
  lookup->bitrev = piVar2;
  if (3 < n) {
    lVar5 = 0;
    iVar11 = 0;
    do {
      dVar13 = (double)iVar11 * (3.141592653589793 / (double)n);
      dVar14 = cos(dVar13);
      pfVar3[lVar5] = (float)dVar14;
      dVar13 = sin(dVar13);
      pfVar3[lVar5 + 1] = -(float)dVar13;
      dVar13 = (double)((int)lVar5 + 1) * (3.141592653589793 / (double)(n * 2));
      dVar14 = cos(dVar13);
      pfVar3[(ulong)((uint)n >> 1) + lVar5] = (float)dVar14;
      dVar13 = sin(dVar13);
      pfVar3[(ulong)((uint)n >> 1) + lVar5 + 1] = (float)dVar13;
      iVar11 = iVar11 + 4;
      lVar5 = lVar5 + 2;
    } while ((ulong)uVar6 * 2 != lVar5);
    if (7 < n) {
      uVar10 = 0;
      do {
        dVar13 = (double)((int)uVar10 + 2) * (3.141592653589793 / (double)n);
        dVar14 = cos(dVar13);
        *(float *)((long)pfVar3 + uVar10 * 2 + (ulong)(uint)n * 4) = (float)(dVar14 * 0.5);
        dVar13 = sin(dVar13);
        *(float *)((long)pfVar3 + uVar10 * 2 + (ulong)(uint)n * 4 + 4) = (float)(dVar13 * -0.5);
        uVar10 = uVar10 + 4;
      } while (((uint)n >> 3) * 4 != uVar10);
      cVar1 = (char)(int)dVar12;
      uVar6 = 1 << (cVar1 - 2U & 0x1f);
      if (7 < n) {
        uVar10 = 0;
        do {
          uVar7 = 0;
          bVar4 = 0;
          uVar8 = uVar6;
          do {
            uVar9 = 1 << (bVar4 & 0x1f);
            if ((uVar8 & (uint)uVar10) == 0) {
              uVar9 = 0;
            }
            uVar7 = uVar7 | uVar9;
            bVar4 = bVar4 + 1;
            uVar8 = (int)uVar6 >> (bVar4 & 0x1f);
          } while (uVar8 != 0);
          piVar2[uVar10 * 2] = -2 - (uVar7 | -1 << (cVar1 - 1U & 0x1f));
          piVar2[uVar10 * 2 + 1] = uVar7;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)n >> 3);
      }
    }
  }
  lookup->scale = 4.0 / (float)n;
  return;
}

Assistant:

void mdct_init(mdct_lookup *lookup,int n){
  int   *bitrev=_ogg_malloc(sizeof(*bitrev)*(n/4));
  DATA_TYPE *T=_ogg_malloc(sizeof(*T)*(n+n/4));

  int i;
  int n2=n>>1;
  int log2n=lookup->log2n=rint(log((float)n)/log(2.f));
  lookup->n=n;
  lookup->trig=T;
  lookup->bitrev=bitrev;

/* trig lookups... */

  for(i=0;i<n/4;i++){
    T[i*2]=FLOAT_CONV(cos((M_PI/n)*(4*i)));
    T[i*2+1]=FLOAT_CONV(-sin((M_PI/n)*(4*i)));
    T[n2+i*2]=FLOAT_CONV(cos((M_PI/(2*n))*(2*i+1)));
    T[n2+i*2+1]=FLOAT_CONV(sin((M_PI/(2*n))*(2*i+1)));
  }
  for(i=0;i<n/8;i++){
    T[n+i*2]=FLOAT_CONV(cos((M_PI/n)*(4*i+2))*.5);
    T[n+i*2+1]=FLOAT_CONV(-sin((M_PI/n)*(4*i+2))*.5);
  }

  /* bitreverse lookup... */

  {
    int mask=(1<<(log2n-1))-1,i,j;
    int msb=1<<(log2n-2);
    for(i=0;i<n/8;i++){
      int acc=0;
      for(j=0;msb>>j;j++)
        if((msb>>j)&i)acc|=1<<j;
      bitrev[i*2]=((~acc)&mask)-1;
      bitrev[i*2+1]=acc;

    }
  }
  lookup->scale=FLOAT_CONV(4.f/n);
}